

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall
amrex::FillPatchIteratorHelper::FillPatchIteratorHelper
          (FillPatchIteratorHelper *this,AmrLevel *amrlevel,MultiFab *leveldata)

{
  pointer in_RDX;
  pointer in_RSI;
  Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  *in_RDI;
  pointer *ppVVar1;
  
  (in_RDI->
  super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ).
  super__Vector_base<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RSI;
  (in_RDI->
  super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ).
  super__Vector_base<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_RDX;
  ppVVar1 = &(in_RDI->
             super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
             ).
             super__Vector_base<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  MultiFabCopyDescriptor::MultiFabCopyDescriptor((MultiFabCopyDescriptor *)0x13977eb);
  std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>::allocator
            ((allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_> *)
             0x139781a);
  Vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ::vector(in_RDI,(size_type)ppVVar1,(allocator_type *)0x139782e);
  std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>::~allocator
            ((allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_> *)
             0x139783a);
  std::map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>::map
            ((map<int,_amrex::Box,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
              *)0x139784b);
  std::
  map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
  ::map((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
         *)0x139785c);
  std::
  map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
  ::map((map<int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
         *)0x139786d);
  std::
  map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
  ::map((map<int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
         *)0x139787e);
  return;
}

Assistant:

FillPatchIteratorHelper::FillPatchIteratorHelper (AmrLevel& amrlevel,
                                                  MultiFab& leveldata)
    :
    m_amrlevel(amrlevel),
    m_leveldata(leveldata),
    m_mfid(m_amrlevel.level+1)
{}